

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O1

NTRUEncodeSchedule * ntru_encode_ciphertext_schedule(uint p,uint q)

{
  uint16_t *ms_in;
  NTRUEncodeSchedule *pNVar1;
  ulong uVar2;
  ulong factor1;
  
  factor1 = (ulong)p;
  ms_in = (uint16_t *)safemalloc(factor1,2,0);
  if (p != 0) {
    uVar2 = 0;
    do {
      ms_in[uVar2] = (short)(((q >> 1) + 1) / 3) * 2 + 1;
      uVar2 = uVar2 + 1;
    } while (factor1 != uVar2);
  }
  pNVar1 = ntru_encode_schedule(ms_in,factor1);
  safefree(ms_in);
  return pNVar1;
}

Assistant:

static NTRUEncodeSchedule *ntru_encode_ciphertext_schedule(
    unsigned p, unsigned q)
{
    unsigned m = ciphertext_m(q);
    uint16_t *ms = snewn(p, uint16_t);
    for (size_t i = 0; i < p; i++)
        ms[i] = m;
    NTRUEncodeSchedule *sched = ntru_encode_schedule(ms, p);
    sfree(ms);
    return sched;
}